

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_module.cpp
# Opt level: O3

ModBody * __thiscall
pfederc::Parser::parseModBody(ModBody *__return_storage_ptr__,Parser *this,bool isprog)

{
  short sVar1;
  Token *pTVar2;
  size_t sVar3;
  pointer pPVar4;
  long *plVar5;
  pointer pcVar6;
  size_t sVar7;
  pointer pPVar8;
  istream *piVar9;
  pointer pTVar10;
  TokenType *pTVar11;
  bool bVar12;
  undefined1 uVar13;
  ExprType EVar14;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar15;
  pointer pEVar16;
  pointer pEVar17;
  pointer pEVar18;
  long lVar19;
  Parser *pPVar20;
  long lVar21;
  vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
  *this_00;
  ulong uVar22;
  pointer pTVar23;
  Exprs defs;
  Exprs imports;
  Error<pfederc::SyntaxErrorCode> *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [40];
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_98;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8 = 0;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0._32_8_ = __return_storage_ptr__;
  bVar12 = Token::operator!=(this->lexer->currentToken,TOK_EOL);
  local_c0._8_8_ = (Token *)0x0;
  if (!bVar12) {
LAB_00119080:
    if (isprog) {
      bVar12 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      uVar13 = (undefined1)local_c8;
      if (bVar12) {
        pTVar2 = this->lexer->currentToken;
        local_c0._0_8_ = operator_new(0x38);
        pcVar6 = (pointer)(pTVar2->pos).endIndex;
        *(Level *)&((Lexer *)local_c0._0_8_)->_vptr_Lexer = LVL_ERROR;
        *(SyntaxErrorCode *)((long)&((Lexer *)local_c0._0_8_)->_vptr_Lexer + 4) =
             STX_ERR_EXPECTED_EOF;
        piVar9 = (istream *)(pTVar2->pos).startIndex;
        ((Position *)&((Lexer *)local_c0._0_8_)->cfg)->line = (pTVar2->pos).line;
        ((Lexer *)local_c0._0_8_)->input = piVar9;
        (((Lexer *)local_c0._0_8_)->filePath)._M_dataplus._M_p = pcVar6;
        (((Lexer *)local_c0._0_8_)->filePath)._M_string_length = 0;
        (((Lexer *)local_c0._0_8_)->filePath).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(((Lexer *)local_c0._0_8_)->filePath).field_2 + 8) = 0;
        generateError((Parser *)local_58,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_58);
        if ((Expr *)local_c0._0_8_ != (Expr *)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_c0,
                     (Error<pfederc::SyntaxErrorCode> *)local_c0._0_8_);
        }
        uVar13 = true;
      }
    }
    else {
      uVar13 = (undefined1)local_c8;
    }
    uVar15 = local_c0._32_8_;
    (((_Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
       *)local_c0._32_8_)->
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl = (bool)uVar13;
    (((_Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
       *)local_c0._32_8_)->
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_98.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (((_Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
       *)local_c0._32_8_)->
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_98.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (((_Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
       *)local_c0._32_8_)->
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((_Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
       *)local_c0._32_8_)->
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_78.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (((_Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
       *)local_c0._32_8_)->
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (((_Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
       *)local_c0._32_8_)->
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((_Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
       *)local_c0._32_8_)->super__Head_base<0UL,_const_pfederc::Token_*,_false>)._M_head_impl =
         (Token *)local_c0._8_8_;
    std::
    vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ::~vector(&local_98);
    std::
    vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ::~vector(&local_78);
    return (ModBody *)uVar15;
  }
  local_c0._8_8_ = (Token *)0x0;
  local_c0._16_8_ = &PTR__BiOpExpr_0012b990;
  local_c0._24_8_ = &PTR__TokenExpr_0012b760;
  local_c8 = 0;
LAB_00118af3:
  while( true ) {
    bVar12 = Token::operator==(this->lexer->currentToken,TOK_EOL);
    if (!bVar12) break;
    Lexer::next(this->lexer);
  }
  bVar12 = Token::operator==(this->lexer->currentToken,TOK_EOF);
  pTVar10 = _TERMINATE_MOD_TOKEN.
            super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (!bVar12) {
    if (isprog) {
      parseExpression((Parser *)local_c0,(Precedence)this);
      bVar12 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      if ((!bVar12 && isprog) ||
         (bVar12 = Token::operator!=(this->lexer->currentToken,TOK_EOL), !bVar12))
      goto LAB_00118da3;
      pTVar2 = this->lexer->currentToken;
      local_d0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
      sVar3 = (pTVar2->pos).endIndex;
      local_d0->logLevel = LVL_ERROR;
      local_d0->err = STX_ERR_EXPECTED_EOF_EOL;
      sVar7 = (pTVar2->pos).startIndex;
      (local_d0->pos).line = (pTVar2->pos).line;
      (local_d0->pos).startIndex = sVar7;
      (local_d0->pos).endIndex = sVar3;
      (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pPVar20 = (Parser *)&stack0xffffffffffffffc8;
LAB_00118d6a:
      generateError(pPVar20,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                             *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)pPVar20
                );
      if (local_d0 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_d0,local_d0);
      }
      skipToStmtEol(this);
      local_c8 = CONCAT71(extraout_var,1);
    }
    else {
      pTVar2 = this->lexer->currentToken;
      lVar21 = (long)_TERMINATE_MOD_TOKEN.
                     super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)_TERMINATE_MOD_TOKEN.
                     super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      pTVar23 = _TERMINATE_MOD_TOKEN.
                super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < lVar21 >> 3) {
        lVar19 = (lVar21 >> 3) + 1;
        pTVar11 = _TERMINATE_MOD_TOKEN.
                  super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>.
                  _M_impl.super__Vector_impl_data._M_start + 2;
        do {
          pTVar23 = pTVar11;
          bVar12 = Token::operator==(pTVar2,pTVar23[-2]);
          if (bVar12) {
            pTVar23 = pTVar23 + -2;
            goto LAB_00118ce2;
          }
          bVar12 = Token::operator==(pTVar2,pTVar23[-1]);
          if (bVar12) {
            pTVar23 = pTVar23 + -1;
            goto LAB_00118ce2;
          }
          bVar12 = Token::operator==(pTVar2,*pTVar23);
          if (bVar12) goto LAB_00118ce2;
          bVar12 = Token::operator==(pTVar2,pTVar23[1]);
          if (bVar12) {
            pTVar23 = pTVar23 + 1;
            goto LAB_00118ce2;
          }
          lVar19 = lVar19 + -1;
          lVar21 = lVar21 + -8;
          pTVar11 = pTVar23 + 4;
        } while (1 < lVar19);
        pTVar23 = pTVar23 + 2;
      }
      lVar21 = lVar21 >> 1;
      if (lVar21 == 1) {
LAB_00118cc5:
        bVar12 = Token::operator==(pTVar2,*pTVar23);
        if (!bVar12) {
          pTVar23 = pTVar10;
        }
LAB_00118ce2:
        if (pTVar23 != pTVar10) goto LAB_00119080;
      }
      else {
        if (lVar21 == 2) {
LAB_00118caa:
          bVar12 = Token::operator==(pTVar2,*pTVar23);
          if (!bVar12) {
            pTVar23 = pTVar23 + 1;
            goto LAB_00118cc5;
          }
          goto LAB_00118ce2;
        }
        if (lVar21 == 3) {
          bVar12 = Token::operator==(pTVar2,*pTVar23);
          if (!bVar12) {
            pTVar23 = pTVar23 + 1;
            goto LAB_00118caa;
          }
          goto LAB_00118ce2;
        }
      }
      parseExpression((Parser *)local_c0,(Precedence)this);
      bVar12 = Token::operator!=(this->lexer->currentToken,TOK_EOL);
      if (bVar12) {
        pTVar2 = this->lexer->currentToken;
        local_d0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
        sVar3 = (pTVar2->pos).endIndex;
        local_d0->logLevel = LVL_ERROR;
        local_d0->err = STX_ERR_EXPECTED_EOL;
        sVar7 = (pTVar2->pos).startIndex;
        (local_d0->pos).line = (pTVar2->pos).line;
        (local_d0->pos).startIndex = sVar7;
        (local_d0->pos).endIndex = sVar3;
        (local_d0->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_d0->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_d0->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar20 = (Parser *)(local_48 + 8);
        goto LAB_00118d6a;
      }
LAB_00118da3:
      bVar12 = Token::operator==(this->lexer->currentToken,TOK_EOL);
      if (bVar12) {
        Lexer::next(this->lexer);
      }
    }
    uVar15 = local_c0._0_8_;
    if ((Expr *)local_c0._0_8_ != (Expr *)0x0) {
      if (isprog) {
        uVar22 = (long)_ALLOWED_EXPR_PROG.
                       super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)_ALLOWED_EXPR_PROG.
                       super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        pEVar16 = _ALLOWED_EXPR_PROG.
                  super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pEVar18 = _ALLOWED_EXPR_PROG.
                  super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (long)uVar22 >> 4) {
          EVar14 = *(ExprType *)&(((string *)(local_c0._0_8_ + 0x18))->_M_dataplus)._M_p;
          pEVar17 = (pointer)((uVar22 & 0xfffffffffffffff0) +
                             (long)_ALLOWED_EXPR_PROG.
                                   super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          lVar21 = ((long)uVar22 >> 4) + 1;
          pEVar18 = _ALLOWED_EXPR_PROG.
                    super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                    _M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if (pEVar18[-2] == EVar14) goto LAB_00118ec4;
            if (pEVar18[-1] == EVar14) goto LAB_00118eca;
            if (*pEVar18 == EVar14) goto LAB_00118efb;
            if (pEVar18[1] == EVar14) goto LAB_00118ef7;
            lVar21 = lVar21 + -1;
            pEVar18 = pEVar18 + 4;
          } while (1 < lVar21);
LAB_00118e98:
          uVar22 = (long)pEVar16 - (long)pEVar17;
          pEVar18 = pEVar17;
        }
      }
      else {
        uVar22 = (long)_ALLOWED_EXPR_MOD.
                       super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)_ALLOWED_EXPR_MOD.
                       super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        pEVar16 = _ALLOWED_EXPR_MOD.
                  super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pEVar18 = _ALLOWED_EXPR_MOD.
                  super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (long)uVar22 >> 4) {
          EVar14 = *(ExprType *)&(((string *)(local_c0._0_8_ + 0x18))->_M_dataplus)._M_p;
          pEVar17 = (pointer)((uVar22 & 0xfffffffffffffff0) +
                             (long)_ALLOWED_EXPR_MOD.
                                   super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          lVar21 = ((long)uVar22 >> 4) + 1;
          pEVar18 = _ALLOWED_EXPR_MOD.
                    super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                    _M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if (pEVar18[-2] == EVar14) goto LAB_00118ec4;
            if (pEVar18[-1] == EVar14) goto LAB_00118eca;
            if (*pEVar18 == EVar14) goto LAB_00118efb;
            if (pEVar18[1] == EVar14) goto LAB_00118ef7;
            lVar21 = lVar21 + -1;
            pEVar18 = pEVar18 + 4;
          } while (1 < lVar21);
          goto LAB_00118e98;
        }
      }
      lVar21 = (long)uVar22 >> 2;
      if (lVar21 == 3) {
        EVar14 = *(ExprType *)&(((string *)(local_c0._0_8_ + 0x18))->_M_dataplus)._M_p;
        if (*pEVar18 != EVar14) {
          pEVar18 = pEVar18 + 1;
          goto LAB_00118ee4;
        }
        goto LAB_00118efb;
      }
      if (lVar21 == 2) {
        EVar14 = *(ExprType *)&(((string *)(local_c0._0_8_ + 0x18))->_M_dataplus)._M_p;
LAB_00118ee4:
        if (*pEVar18 != EVar14) {
          pEVar18 = pEVar18 + 1;
          goto LAB_00118eec;
        }
        goto LAB_00118efb;
      }
      if (lVar21 == 1) {
        EVar14 = *(ExprType *)&(((string *)(local_c0._0_8_ + 0x18))->_M_dataplus)._M_p;
LAB_00118eec:
        if (*pEVar18 != EVar14) {
          pEVar18 = pEVar16;
        }
        goto LAB_00118efb;
      }
      goto LAB_00118f6d;
    }
    goto LAB_00119047;
  }
  goto LAB_00119080;
LAB_00118ec4:
  pEVar18 = pEVar18 + -2;
  goto LAB_00118efb;
LAB_00118eca:
  pEVar18 = pEVar18 + -1;
  goto LAB_00118efb;
LAB_00118ef7:
  pEVar18 = pEVar18 + 1;
LAB_00118efb:
  if (pEVar18 == pEVar16) {
LAB_00118f6d:
    if (*(int *)&(((string *)(local_c0._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12) {
      if (*(pointer *)local_c0._0_8_ != (pointer)local_c0._16_8_) {
        __cxa_bad_cast();
      }
      sVar1 = (short)((Position *)(local_c0._0_8_ + 0x40))->line;
      if (sVar1 == 0x32) {
LAB_00118fb4:
        this_00 = (vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                   *)&local_98;
        goto LAB_00118fb9;
      }
      if ((sVar1 == 0x3d) &&
         (plVar5 = (long *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_c0._0_8_ + 0x48))->_M_allocated_capacity,
         (int)plVar5[3] == 0x12)) {
        if ((pointer)*plVar5 != (pointer)local_c0._16_8_) {
          __cxa_bad_cast();
        }
        if ((short)plVar5[8] == 0x53) goto LAB_00118fb4;
      }
    }
    local_d0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    pPVar4 = *(pointer *)(uVar15 + 0x30);
    local_d0->logLevel = LVL_ERROR;
    local_d0->err = STX_ERR_INVALID_EXPR;
    pPVar8 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(uVar15 + 0x28))->_M_allocated_capacity;
    (local_d0->pos).line =
         (size_t)(((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(uVar15 + 0x20))
                 ->super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    (local_d0->pos).startIndex = (size_t)pPVar8;
    (local_d0->pos).endIndex = (size_t)pPVar4;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pPVar20 = (Parser *)local_48;
  }
  else {
    this_00 = (vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
               *)&local_78;
    if (EVar14 == EXPR_USE) {
LAB_00118fb9:
      std::
      vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
      ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                (this_00,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_c0)
      ;
      goto LAB_00119037;
    }
    if (EVar14 != EXPR_PROGNAME) goto LAB_00118fb4;
    if ((Token *)local_c0._8_8_ == (Token *)0x0) {
      if (*(pointer *)local_c0._0_8_ != (pointer)local_c0._24_8_) {
        __cxa_bad_cast();
      }
      local_c0._8_8_ = *(undefined8 *)(local_c0._0_8_ + 0x38);
      goto LAB_00119037;
    }
    local_d0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    pPVar4 = *(pointer *)(uVar15 + 0x30);
    local_d0->logLevel = LVL_ERROR;
    local_d0->err = STX_ERR_PROGNAME;
    pPVar8 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(uVar15 + 0x28))->_M_allocated_capacity;
    (local_d0->pos).line =
         (size_t)(((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(uVar15 + 0x20))
                 ->super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    (local_d0->pos).startIndex = (size_t)pPVar8;
    (local_d0->pos).endIndex = (size_t)pPVar4;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pPVar20 = (Parser *)(local_58 + 8);
  }
  generateError(pPVar20,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)pPVar20);
  uVar15 = extraout_RAX;
  if (local_d0 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_d0,local_d0);
    uVar15 = extraout_RAX_00;
  }
  local_c8 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
LAB_00119037:
  if ((Lexer *)local_c0._0_8_ != (Lexer *)0x0) {
    (*(*(_func_int ***)local_c0._0_8_)[1])();
  }
LAB_00119047:
  bVar12 = Token::operator!=(this->lexer->currentToken,TOK_EOL);
  if (!bVar12) goto LAB_00119080;
  goto LAB_00118af3;
}

Assistant:

ModBody Parser::parseModBody(bool isprog) noexcept {
  const Token *progName{nullptr};
  Exprs imports;
  Exprs defs;

  bool err = false;

  while(*lexer.getCurrentToken() != TokenType::TOK_EOL) {
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next(); // eat eols
    if (*lexer.getCurrentToken() == TokenType::TOK_EOF)
      break;

    const Token *tok = lexer.getCurrentToken();

    // terminate module on termination token
    if (!isprog && std::any_of(
        _TERMINATE_MOD_TOKEN.begin(), _TERMINATE_MOD_TOKEN.end(),
        [&tok](TokenType type) { return *tok == type; }))
      break;

    std::unique_ptr<Expr> expr(parseExpression());
    if (((isprog && *lexer.getCurrentToken() != TokenType::TOK_EOF)
        || !isprog)
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      if (isprog)
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOF_EOL, lexer.getCurrentToken()->getPosition()));
      else
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      err = true;

      skipToStmtEol();
    } else if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next(); // eat eol
    }

    if (expr) {
      const bool validexpr = (isprog ?
        std::any_of(_ALLOWED_EXPR_PROG.begin(), _ALLOWED_EXPR_PROG.end(),
          [&expr](ExprType type) { return expr->getType() == type; }) :
        std::any_of(_ALLOWED_EXPR_MOD.begin(), _ALLOWED_EXPR_MOD.end(),
          [&expr](ExprType type) { return expr->getType() == type; })) ||
      // valid global assignments
        isBiOpExpr(*expr, TokenType::TOK_OP_ASG_DCL) ||
        (isBiOpExpr(*expr, TokenType::TOK_OP_ASG) &&
        isBiOpExpr(dynamic_cast<BiOpExpr&>(*expr).getLeft(), TokenType::TOK_OP_DCL));

      if (!validexpr) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_EXPR, expr->getPosition()));
        err = true;
        continue;
      }

      switch (expr->getType()) {
      case ExprType::EXPR_PROGNAME:
        if (progName) {
          generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_PROGNAME, expr->getPosition()));
          err = true;
        } else
          progName = dynamic_cast<ProgNameExpr&>(*expr).getTokenPtr();

        break;
      case ExprType::EXPR_USE:
        imports.push_back(std::move(expr));
        break;
      default:
        defs.push_back(std::move(expr));
        break;
      }
    }
  }

  if (isprog && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOF, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  return ModBody(progName, std::move(imports), std::move(defs), err);
}